

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

TypeNames * __thiscall
wasm::PrintSExpression::TypePrinter::getNames
          (TypeNames *__return_storage_ptr__,TypePrinter *this,HeapType type)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_40;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_38;
  iterator it_1;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_28;
  iterator it;
  TypePrinter *this_local;
  HeapType type_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)this;
  this_local = (TypePrinter *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  if (this->parent->currModule != (Module *)0x0) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
         ::find(&this->parent->currModule->typeNames,(key_type *)&this_local);
    it_1 = std::
           unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
           ::end(&this->parent->currModule->typeNames);
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       &it_1.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                      );
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                           *)&local_28);
      TypeNames::TypeNames(__return_storage_ptr__,&ppVar2->second);
      return __return_storage_ptr__;
    }
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
         ::find(&this->fallbackNames,(key_type *)&this_local);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
         ::end(&this->fallbackNames);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                           *)&local_38);
      TypeNames::TypeNames(__return_storage_ptr__,&ppVar2->second);
      return __return_storage_ptr__;
    }
  }
  DefaultTypeNameGenerator::getNames(__return_storage_ptr__,&this->fallback,(HeapType)this_local);
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
      if (parent.currModule) {
        if (auto it = parent.currModule->typeNames.find(type);
            it != parent.currModule->typeNames.end()) {
          return it->second;
        }
        // In principle we should always have at least a fallback name for every
        // type in the module, so this lookup should never fail. In practice,
        // though, the `printExpression` variants deliberately avoid walking the
        // module to find unnamed types so they can be safely used in a
        // function-parallel context. That means we can have a module but not
        // have generated the fallback names, so this lookup can fail, in which
        // case we generate a name on demand.
        if (auto it = fallbackNames.find(type); it != fallbackNames.end()) {
          return it->second;
        }
      }
      return fallback.getNames(type);
    }